

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBControlTransfers.h
# Opt level: O3

void __thiscall
USBControlTransferParser::SetHIDUsagePage(USBControlTransferParser *this,U16 usagePage)

{
  unsigned_short *puVar1;
  ulong in_RAX;
  iterator __position;
  undefined8 uStack_18;
  
  puVar1 = (this->mHidUsagePageStack).
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
  __position._M_current =
       (this->mHidUsagePageStack).
       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (puVar1 == __position._M_current) {
    uStack_18 = in_RAX & 0xffffffffffff;
    if (puVar1 == (this->mHidUsagePageStack).
                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
      _M_realloc_insert<unsigned_short>
                (&this->mHidUsagePageStack,__position,(unsigned_short *)((long)&uStack_18 + 6));
      __position._M_current =
           (this->mHidUsagePageStack).
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      *__position._M_current = 0;
      __position._M_current = __position._M_current + 1;
      (this->mHidUsagePageStack).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
      ._M_impl.super__Vector_impl_data._M_finish = __position._M_current;
    }
  }
  __position._M_current[-1] = usagePage;
  return;
}

Assistant:

void SetHIDUsagePage( U16 usagePage )
    {
        if( mHidUsagePageStack.empty() )
            mHidUsagePageStack.push_back( 0 );

        mHidUsagePageStack.back() = usagePage;
    }